

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

void __thiscall
Js::DynamicTypeHandler::ExtractSnapHandler
          (DynamicTypeHandler *this,SnapHandler *handler,ThreadContext *threadContext,
          SlabAllocator *alloc)

{
  uint uVar1;
  uint uVar2;
  SnapHandlerPropertyEntry *__s;
  
  handler->HandlerId = (TTD_PTR_ID)this;
  handler->InlineSlotCapacity = (uint)this->inlineSlotCapacity;
  uVar1 = this->slotCapacity;
  handler->MaxPropertyIndex = 0;
  handler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
  handler->TotalSlotCapacity = uVar1;
  if ((ulong)uVar1 != 0) {
    __s = TTD::SlabAllocatorBase<0>::
          SlabReserveArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(alloc,(ulong)uVar1);
    handler->PropertyInfoArray = __s;
    memset(__s,0,(ulong)handler->TotalSlotCapacity << 3);
    uVar2 = (*this->_vptr_DynamicTypeHandler[0x65])
                      (this,handler->PropertyInfoArray,threadContext,alloc);
    handler->MaxPropertyIndex = uVar2;
    uVar1 = handler->TotalSlotCapacity;
    if (uVar1 < uVar2) {
      TTDAbort_unrecoverable_error("Huh we have more property entries than slots to put them in.");
    }
    if (uVar2 == 0) {
      TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>
                (alloc,(ulong)uVar1);
      handler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
    }
    else {
      TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>
                (alloc,(ulong)uVar2,(ulong)uVar1);
    }
  }
  handler->IsExtensibleFlag = this->flags & 1;
  return;
}

Assistant:

void DynamicTypeHandler::ExtractSnapHandler(TTD::NSSnapType::SnapHandler* handler, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        handler->HandlerId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(this);

        handler->InlineSlotCapacity = this->inlineSlotCapacity;
        handler->TotalSlotCapacity = this->slotCapacity;

        handler->MaxPropertyIndex = 0;
        handler->PropertyInfoArray = nullptr;

        if(handler->TotalSlotCapacity != 0)
        {
            handler->PropertyInfoArray = alloc.SlabReserveArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->TotalSlotCapacity);
            memset(handler->PropertyInfoArray, 0, handler->TotalSlotCapacity * sizeof(TTD::NSSnapType::SnapHandlerPropertyEntry));

            handler->MaxPropertyIndex = this->ExtractSlotInfo_TTD(handler->PropertyInfoArray, threadContext, alloc);
            TTDAssert(handler->MaxPropertyIndex <= handler->TotalSlotCapacity, "Huh we have more property entries than slots to put them in.");

            if(handler->MaxPropertyIndex != 0)
            {
                alloc.SlabCommitArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->MaxPropertyIndex, handler->TotalSlotCapacity);
            }
            else
            {
                alloc.SlabAbortArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->TotalSlotCapacity);
                handler->PropertyInfoArray = nullptr;
            }
        }

        //The kind of type this snaptype record is associated with and the extensible flag
        handler->IsExtensibleFlag = this->GetFlags() & Js::DynamicTypeHandler::IsExtensibleFlag;
    }